

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O2

WW<127UL> * __thiscall GF2::WW<127UL>::ShLo(WW<127UL> *this,size_t shift)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  
  if (shift < 0x7f) {
    uVar2 = shift >> 6;
    if ((shift & 0x3f) == 0) {
      lVar4 = 2 - uVar2;
      for (lVar3 = -0x10; uVar2 * 8 + lVar3 != 0; lVar3 = lVar3 + 8) {
        *(undefined8 *)((long)this[1]._words + lVar3) =
             *(undefined8 *)((long)this[1]._words + lVar3 + uVar2 * 8);
      }
    }
    else {
      for (lVar4 = -8; uVar2 * 8 + lVar4 != 0; lVar4 = lVar4 + 8) {
        bVar1 = (byte)shift & 0x3f;
        *(ulong *)((long)this->_words + lVar4 + 8) =
             *(ulong *)((long)this->_words + lVar4 + uVar2 * 8 + 8) >> bVar1 |
             *(long *)((long)this[1]._words + lVar4 + uVar2 * 8) << 0x40 - bVar1;
      }
      *(word *)((long)this + (1 - uVar2) * 8) = this->_words[1] >> (sbyte)(shift & 0x3f);
      lVar4 = 2 - uVar2;
    }
    for (; lVar4 != 2; lVar4 = lVar4 + 1) {
      this->_words[lVar4] = 0;
    }
    return this;
  }
  this->_words[0] = 0;
  this->_words[1] = 0;
  return this;
}

Assistant:

WW& ShLo(size_t shift)
	{	
		if (shift < _n)
		{
			size_t wshift = shift / B_PER_W, pos;
			// величина сдвига не кратна длине слова?
			if (shift %= B_PER_W)
			{
				// сдвиг всех слов, кроме последнего
				for (pos = 0; pos + wshift + 1 < _wcount; pos++)
					_words[pos] = (_words[pos + wshift] >> shift) |
						(_words[pos + wshift + 1] << (B_PER_W - shift));
				// последнее слово
				_words[pos] = _words[pos + wshift] >> shift, ++pos;
			}
			// величина сдвига кратна длине слова
			else for (pos = 0; pos + wshift < _wcount; ++pos)
				_words[pos] = _words[pos + wshift];
			// обнуление правых слов
			for (; pos < _wcount; _words[pos++] = 0);
		}
		else 
			SetAllZero();
		return *this;
	}